

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* streamToEvents_abi_cxx11_(TestStream *input,char *eventFormat)

{
  EventStream *this;
  ClockSync *__x;
  char *in_RDX;
  string *in_RDI;
  ostringstream str;
  ClockSync *in_stack_000000e0;
  WriterProp *in_stack_000000e8;
  Event *in_stack_000000f0;
  ostream *in_stack_000000f8;
  PrettyPrinter *in_stack_00000100;
  Event *event;
  PrettyPrinter pp;
  EventStream eventStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  EventStream *in_stack_fffffffffffffc90;
  string *eventFormat_00;
  PrettyPrinter *in_stack_fffffffffffffcd0;
  EntryStream *in_stack_fffffffffffffcf0;
  EventStream *in_stack_fffffffffffffcf8;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [128];
  EventStream local_e0;
  byte local_19;
  char *local_18;
  
  local_19 = 0;
  eventFormat_00 = in_RDI;
  local_18 = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x26eb79);
  binlog::EventStream::EventStream(in_stack_fffffffffffffc90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,local_18,&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"%Y.%m.%d %H:%M:%S",&local_189);
  binlog::PrettyPrinter::PrettyPrinter(in_stack_fffffffffffffcd0,eventFormat_00,in_RDI);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  while( true ) {
    this = (EventStream *)
           binlog::EventStream::nextEvent(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    if (this == (EventStream *)0x0) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffcf0);
    binlog::EventStream::writerProp(&local_e0);
    __x = binlog::EventStream::clockSync(&local_e0);
    binlog::PrettyPrinter::printEvent
              (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
               in_stack_000000e0);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)__x);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffcf0);
    in_stack_fffffffffffffc90 = this;
  }
  local_19 = 1;
  binlog::PrettyPrinter::~PrettyPrinter((PrettyPrinter *)in_stack_fffffffffffffc90);
  binlog::EventStream::~EventStream(in_stack_fffffffffffffc90);
  if ((local_19 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)eventFormat_00;
}

Assistant:

std::vector<std::string> streamToEvents(TestStream& input, const char* eventFormat)
{
  std::vector<std::string> result;

  binlog::EventStream eventStream;
  binlog::PrettyPrinter pp(eventFormat, "%Y.%m.%d %H:%M:%S");

  while (const binlog::Event* event = eventStream.nextEvent(input))
  {
    std::ostringstream str;
    pp.printEvent(str, *event, eventStream.writerProp(), eventStream.clockSync());
    result.push_back(str.str());
  }

  return result;
}